

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

apx_socketServer_t * apx_socketServer_new(apx_server_tag *apx_server)

{
  apx_socketServer_t *paVar1;
  
  paVar1 = (apx_socketServer_t *)malloc(0x210);
  if (paVar1 != (apx_socketServer_t *)0x0) {
    paVar1->parent = apx_server;
    paVar1->tcp_port = 0;
    paVar1->unix_server_file = (char *)0x0;
    paVar1->tcp_connection_tag = (char *)0x0;
    paVar1->unix_connection_tag = (char *)0x0;
    paVar1->is_tcp_server_started = false;
    paVar1->is_unix_server_started = false;
  }
  return paVar1;
}

Assistant:

apx_socketServer_t* apx_socketServer_new(struct apx_server_tag *apx_server)
{
   apx_socketServer_t *self = (apx_socketServer_t*) malloc(sizeof(apx_socketServer_t));
   if (self != 0)
   {
      apx_socketServer_create(self, apx_server);
   }
   return self;
}